

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

void __thiscall lest::ctx::ctx(ctx *this,env *environment_,text *proposition_)

{
  value_type local_30;
  
  this->environment = environment_;
  this->once = true;
  std::__cxx11::string::string((string *)&local_30,(string *)proposition_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&environment_->ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

ctx( env & environment_, text proposition_ )
    : environment( environment_), once( true )
    {
        environment.push( proposition_);
    }